

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BVSparseNode * __thiscall
BVSparse<Memory::ArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::ArenaAllocator> *this,BVIndex i,Type_conflict **prevNextFieldOut)

{
  Type *ppBVar1;
  uint uVar2;
  BVSparse<Memory::ArenaAllocator> *pBVar3;
  BVSparse<Memory::ArenaAllocator> *pBVar4;
  uint uVar5;
  BVSparse<Memory::ArenaAllocator> *pBVar6;
  BVSparse<Memory::ArenaAllocator> *pBVar7;
  
  uVar5 = i & 0xffffffc0;
  ppBVar1 = &this->lastFoundIndex;
  pBVar4 = (BVSparse<Memory::ArenaAllocator> *)this->head;
  if (pBVar4 == (BVSparse<Memory::ArenaAllocator> *)0x0) {
    pBVar3 = (BVSparse<Memory::ArenaAllocator> *)0x0;
  }
  else {
    if (*(uint *)&pBVar4->lastFoundIndex == uVar5) goto LAB_00786cf6;
    pBVar3 = (BVSparse<Memory::ArenaAllocator> *)this->lastFoundIndex;
    pBVar6 = this;
    pBVar7 = pBVar4;
    if ((pBVar3 != (BVSparse<Memory::ArenaAllocator> *)0x0) &&
       (uVar2 = *(uint *)&pBVar3->lastFoundIndex, uVar2 != *(uint *)&pBVar4->lastFoundIndex)) {
      if (uVar2 == uVar5) {
        *prevNextFieldOut = ppBVar1;
        return (BVSparseNode *)pBVar3;
      }
      pBVar6 = (BVSparse<Memory::ArenaAllocator> *)ppBVar1;
      pBVar7 = pBVar3;
      if (uVar5 <= uVar2) {
        pBVar6 = this;
        pBVar7 = pBVar4;
      }
    }
    pBVar3 = pBVar4;
    if (*(uint *)&pBVar7->lastFoundIndex <= uVar5) {
      pBVar3 = pBVar7;
      this = pBVar6;
    }
  }
  while( true ) {
    pBVar4 = pBVar3;
    if (pBVar4 == (BVSparse<Memory::ArenaAllocator> *)0x0) {
      *ppBVar1 = this->head;
      return (BVSparseNode *)0x0;
    }
    uVar2 = *(uint *)&pBVar4->lastFoundIndex;
    if (uVar5 <= uVar2) break;
    pBVar3 = (BVSparse<Memory::ArenaAllocator> *)pBVar4->head;
    this = pBVar4;
  }
  *ppBVar1 = this->head;
  if (uVar5 != uVar2) {
    return (BVSparseNode *)0x0;
  }
LAB_00786cf6:
  *prevNextFieldOut = &this->head;
  return (BVSparseNode *)pBVar4;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}